

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O2

void CProfileManager::dumpRecursive(CProfileIterator *profileIterator,int spacing)

{
  float fVar1;
  int iVar2;
  CProfileNode *pCVar3;
  CProfileNode *pCVar4;
  int iVar5;
  uint index;
  int iVar6;
  uint uVar7;
  bool bVar8;
  float fVar9;
  undefined4 uVar10;
  float local_6c;
  
  pCVar3 = profileIterator->CurrentParent;
  pCVar4 = pCVar3->Child;
  profileIterator->CurrentChild = pCVar4;
  if (pCVar4 != (CProfileNode *)0x0) {
    if (pCVar3->Parent == (CProfileNode *)0x0) {
      fVar9 = Get_Time_Since_Reset();
    }
    else {
      fVar9 = pCVar3->TotalTime;
    }
    iVar2 = FrameCounter;
    iVar6 = 0;
    iVar5 = 0;
    if (0 < spacing) {
      iVar6 = spacing;
      iVar5 = spacing;
    }
    while (iVar6 != 0) {
      putchar(0x2e);
      iVar6 = iVar6 + -1;
    }
    puts("----------------------------------");
    iVar6 = iVar5;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      putchar(0x2e);
    }
    printf("Profiling: %s (total running time: %.3f ms) ---\n",SUB84((double)fVar9,0),
           profileIterator->CurrentParent->Name);
    pCVar3 = profileIterator->CurrentChild;
    local_6c = 0.0;
    uVar7 = 0;
    while (pCVar3 != (CProfileNode *)0x0) {
      fVar1 = pCVar3->TotalTime;
      iVar6 = iVar5;
      while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
        putchar(0x2e);
      }
      local_6c = local_6c + fVar1;
      printf("%d -- %s (%.2f %%) :: %.3f ms / frame (%d calls)\n",
             SUB84((double)(float)((uint)((fVar1 / fVar9) * 100.0) & -(uint)(1.1920929e-07 < fVar9))
                   ,0),(double)fVar1 / (double)iVar2,(ulong)uVar7,
             profileIterator->CurrentChild->Name,
             (ulong)(uint)profileIterator->CurrentChild->TotalCalls);
      pCVar3 = profileIterator->CurrentChild->Sibling;
      profileIterator->CurrentChild = pCVar3;
      uVar7 = uVar7 + 1;
    }
    while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
      putchar(0x2e);
    }
    if (1.1920929e-07 < fVar9) {
      uVar10 = SUB84((double)(((fVar9 - local_6c) / fVar9) * 100.0),0);
    }
    else {
      uVar10 = 0;
    }
    printf("%s (%.3f %%) :: %.3f ms\n",uVar10,(double)(fVar9 - local_6c),"Unaccounted:");
    for (index = 0; uVar7 != index; index = index + 1) {
      CProfileIterator::Enter_Child(profileIterator,index);
      dumpRecursive(profileIterator,spacing + 3);
      pCVar3 = profileIterator->CurrentParent->Parent;
      pCVar4 = profileIterator->CurrentParent;
      if (pCVar3 != (CProfileNode *)0x0) {
        profileIterator->CurrentParent = pCVar3;
        pCVar4 = pCVar3;
      }
      profileIterator->CurrentChild = pCVar4->Child;
    }
  }
  return;
}

Assistant:

void	CProfileIterator::First(void)
{
	CurrentChild = CurrentParent->Get_Child();
}